

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O0

void __thiscall
polyscope::render::ManagedBuffer<int>::checkDeviceBufferTypeIs
          (ManagedBuffer<int> *this,DeviceBufferType targetType)

{
  int in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string local_c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  string local_90 [8];
  DeviceBufferType *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff90;
  string local_50 [32];
  string local_30 [48];
  
  if (in_ESI != *(int *)&in_RDI[4].field_2) {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90;
    deviceBufferTypeName_abi_cxx11_(in_stack_ffffffffffffff78);
    std::operator+((char *)in_RDI,__rhs);
    std::operator+(in_RDI,(char *)__rhs);
    deviceBufferTypeName_abi_cxx11_(in_stack_ffffffffffffff78);
    std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    exception(in_stack_ffffffffffffff90);
    std::__cxx11::string::~string(local_30);
    std::__cxx11::string::~string(local_c0);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
    std::__cxx11::string::~string(local_90);
  }
  return;
}

Assistant:

void ManagedBuffer<T>::checkDeviceBufferTypeIs(DeviceBufferType targetType) {
  if (targetType != deviceBufferType) {
    exception("ManagedBuffer has wrong type for this operation. Expected " + deviceBufferTypeName(targetType) +
              " but is " + deviceBufferTypeName(deviceBufferType));
  }
}